

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O3

Flags __thiscall absl::lts_20250127::str_format_internal::ConvTag::as_flags(ConvTag *this)

{
  Flags FVar1;
  
  FVar1 = this->tag_;
  if (-1 < (char)FVar1) {
    __assert_fail("!is_conv()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x6f,"Flags absl::str_format_internal::ConvTag::as_flags() const");
  }
  if ((FVar1 & ~(kZero|kAlt|kSignCol|kShowPos|kLeft)) !=
      ~(kNonBasic|kZero|kAlt|kSignCol|kShowPos|kLeft)) {
    __assert_fail("is_flags()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/constexpr_parser.h"
                  ,0x71,"Flags absl::str_format_internal::ConvTag::as_flags() const");
  }
  return FVar1 & (kZero|kAlt|kSignCol|kShowPos|kLeft);
}

Assistant:

constexpr Flags as_flags() const {
    assert(!is_conv());
    assert(!is_length());
    assert(is_flags());
    return static_cast<Flags>(tag_ & 0x1F);
  }